

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::multiply_conv(bool add_to,tensor *dest,tensor *src1,tensor *src2)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar4;
  undefined8 uVar5;
  longlong lVar6;
  longlong lVar7;
  fatal_error *this;
  tensor *in_RCX;
  tensor *in_RDX;
  tensor *in_RSI;
  byte in_DIL;
  long c_2;
  long r_2;
  long k_3;
  long n_2;
  long k_2;
  ostringstream dlib_o_out_2;
  ostringstream dlib_o_out_1;
  long c_1;
  long r_1;
  long k_1;
  long n_1;
  long c;
  long r;
  long k;
  long n;
  ostringstream dlib_o_out;
  float *s2;
  float *s1;
  float *d;
  string *in_stack_fffffffffffff8f0;
  long lVar8;
  tensor *in_stack_fffffffffffff8f8;
  error_type eVar9;
  tensor *in_stack_fffffffffffff900;
  long local_590;
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  ostringstream local_540 [383];
  undefined1 local_3c1;
  ostringstream local_3a0 [376];
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  undefined1 local_1e1;
  ostringstream local_1b0 [376];
  uint *local_38;
  float *local_30;
  float *local_28;
  tensor *local_20;
  tensor *local_18;
  tensor *local_10;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar3 = (*in_RSI->_vptr_tensor[3])();
  local_28 = (float *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*local_18->_vptr_tensor[2])();
  local_30 = (float *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*local_20->_vptr_tensor[2])();
  local_38 = (uint *)CONCAT44(extraout_var_01,iVar3);
  bVar2 = have_same_dimensions(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  if (bVar2) {
    lVar6 = tensor::num_samples(local_20);
    eVar9 = (error_type)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
    if (((lVar6 == 1) && (lVar6 = tensor::nr(local_20), lVar6 == 1)) &&
       (lVar6 = tensor::nc(local_20), lVar6 == 1)) {
      lVar6 = tensor::k(local_20);
      lVar7 = tensor::k(local_18);
      if (lVar6 == lVar7) {
        if ((local_1 & 1) != 0) {
          for (local_1f0 = 0; lVar8 = local_1f0, lVar6 = tensor::num_samples(local_10),
              lVar8 < lVar6; local_1f0 = local_1f0 + 1) {
            for (local_1f8 = 0; lVar8 = local_1f8, lVar6 = tensor::k(local_10), lVar8 < lVar6;
                local_1f8 = local_1f8 + 1) {
              for (local_200 = 0; lVar8 = local_200, lVar6 = tensor::nr(local_10), lVar8 < lVar6;
                  local_200 = local_200 + 1) {
                for (local_208 = 0; lVar8 = local_208, lVar6 = tensor::nc(local_10), lVar8 < lVar6;
                    local_208 = local_208 + 1) {
                  auVar1 = vfmadd213ss_fma(ZEXT416(local_38[local_1f8]),ZEXT416((uint)*local_30),
                                           ZEXT416((uint)*local_28));
                  *local_28 = auVar1._0_4_;
                  local_30 = local_30 + 1;
                  local_28 = local_28 + 1;
                }
              }
            }
          }
          return;
        }
        for (local_210 = 0; lVar8 = local_210, lVar6 = tensor::num_samples(local_10), lVar8 < lVar6;
            local_210 = local_210 + 1) {
          for (local_218 = 0; lVar8 = local_218, lVar6 = tensor::k(local_10), lVar8 < lVar6;
              local_218 = local_218 + 1) {
            for (local_220 = 0; lVar8 = local_220, lVar6 = tensor::nr(local_10), lVar8 < lVar6;
                local_220 = local_220 + 1) {
              for (local_228 = 0; lVar8 = local_228, lVar6 = tensor::nc(local_10), lVar8 < lVar6;
                  local_228 = local_228 + 1) {
                *local_28 = *local_30 * (float)local_38[local_218];
                local_30 = local_30 + 1;
                local_28 = local_28 + 1;
              }
            }
          }
        }
        return;
      }
    }
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar4 = std::operator<<((ostream *)local_1b0,"\n\nError detected at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5e);
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<((ostream *)local_1b0,"Error detected in file ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<((ostream *)local_1b0,"Error detected in function ");
    poVar4 = std::operator<<(poVar4,
                             "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar4,".\n\n");
    poVar4 = std::operator<<((ostream *)local_1b0,"Failing expression was ");
    poVar4 = std::operator<<(poVar4,
                             "src2.num_samples() == 1 && src2.nr() == 1 && src2.nc() == 1 && src2.k() == src1.k()"
                            );
    std::operator<<(poVar4,".\n");
    poVar4 = (ostream *)std::ostream::operator<<(local_1b0,std::boolalpha);
    poVar4 = std::operator<<(poVar4,"");
    std::operator<<(poVar4,"\n");
    local_1e1 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffff900,eVar9,in_stack_fffffffffffff8f0);
    local_1e1 = 0;
    __cxa_throw(uVar5,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  bVar2 = have_same_dimensions(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  eVar9 = (error_type)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
  if (bVar2) {
    lVar6 = tensor::num_samples(local_10);
    if (((lVar6 == 1) && (lVar6 = tensor::nr(local_10), lVar6 == 1)) &&
       (lVar6 = tensor::nc(local_10), lVar6 == 1)) {
      lVar6 = tensor::k(local_10);
      lVar7 = tensor::k(local_18);
      if (lVar6 == lVar7) {
        if ((local_1 & 1) == 0) {
          local_570 = 0;
          while (lVar8 = local_570, lVar6 = tensor::k(local_18), lVar8 < lVar6) {
            local_28[local_570] = 0.0;
            local_570 = local_570 + 1;
          }
        }
        local_578 = 0;
        while (lVar8 = local_578, lVar6 = tensor::num_samples(local_18), lVar8 < lVar6) {
          for (local_580 = 0; lVar6 = tensor::k(local_18), local_580 < lVar6;
              local_580 = local_580 + 1) {
            for (local_588 = 0; lVar6 = tensor::nr(local_18), local_588 < lVar6;
                local_588 = local_588 + 1) {
              for (local_590 = 0; lVar6 = tensor::nc(local_18), local_590 < lVar6;
                  local_590 = local_590 + 1) {
                auVar1 = vfmadd213ss_fma(ZEXT416(*local_38),ZEXT416((uint)*local_30),
                                         ZEXT416((uint)local_28[local_580]));
                local_28[local_580] = auVar1._0_4_;
                local_38 = local_38 + 1;
                local_30 = local_30 + 1;
              }
            }
          }
          local_578 = local_578 + 1;
        }
        return;
      }
    }
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_540);
    poVar4 = std::operator<<((ostream *)local_540,"\n\nError detected at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x84);
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<((ostream *)local_540,"Error detected in file ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<((ostream *)local_540,"Error detected in function ");
    poVar4 = std::operator<<(poVar4,
                             "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar4,".\n\n");
    poVar4 = std::operator<<((ostream *)local_540,"Failing expression was ");
    poVar4 = std::operator<<(poVar4,
                             "dest.num_samples() == 1 && dest.nr() == 1 && dest.nc() == 1 && dest.k() == src1.k()"
                            );
    std::operator<<(poVar4,".\n");
    poVar4 = (ostream *)std::ostream::operator<<(local_540,std::boolalpha);
    poVar4 = std::operator<<(poVar4,"");
    std::operator<<(poVar4,"\n");
    this = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(this,eVar9,in_stack_fffffffffffff8f0);
    __cxa_throw(this,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_3a0);
  poVar4 = std::operator<<((ostream *)local_3a0,"\n\nError detected at line ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x83);
  std::operator<<(poVar4,".\n");
  poVar4 = std::operator<<((ostream *)local_3a0,"Error detected in file ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                          );
  std::operator<<(poVar4,".\n");
  poVar4 = std::operator<<((ostream *)local_3a0,"Error detected in function ");
  poVar4 = std::operator<<(poVar4,
                           "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)"
                          );
  std::operator<<(poVar4,".\n\n");
  poVar4 = std::operator<<((ostream *)local_3a0,"Failing expression was ");
  poVar4 = std::operator<<(poVar4,"have_same_dimensions(src1,src2)");
  std::operator<<(poVar4,".\n");
  poVar4 = (ostream *)std::ostream::operator<<(local_3a0,std::boolalpha);
  poVar4 = std::operator<<(poVar4,"");
  std::operator<<(poVar4,"\n");
  local_3c1 = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)in_stack_fffffffffffff900,eVar9,in_stack_fffffffffffff8f0)
  ;
  local_3c1 = 0;
  __cxa_throw(uVar5,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void multiply_conv (
            bool add_to,
            tensor& dest,
            const tensor& src1,
            const tensor& src2
        )
        {
            auto d = dest.host();
            auto s1 = src1.host();
            auto s2 = src2.host();
            if (have_same_dimensions(dest,src1))
            {
                DLIB_CASSERT(src2.num_samples() == 1 && src2.nr() == 1 && src2.nc() == 1 && src2.k() == src1.k());

                if (add_to)
                {
                    for (long n = 0; n < dest.num_samples(); ++n)
                    {
                        for (long k = 0; k < dest.k(); ++k)
                        {
                            for (long r = 0; r < dest.nr(); ++r)
                            {
                                for (long c = 0; c < dest.nc(); ++c)
                                {
                                    *d++ += (*s1++)*s2[k];
                                }
                            }
                        }
                    }
                }
                else
                {
                    for (long n = 0; n < dest.num_samples(); ++n)
                    {
                        for (long k = 0; k < dest.k(); ++k)
                        {
                            for (long r = 0; r < dest.nr(); ++r)
                            {
                                for (long c = 0; c < dest.nc(); ++c)
                                {
                                    *d++ = (*s1++)*s2[k];
                                }
                            }
                        }
                    }
                }
            }
            else
            {
                DLIB_CASSERT(have_same_dimensions(src1,src2));
                DLIB_CASSERT(dest.num_samples() == 1 && dest.nr() == 1 && dest.nc() == 1 && dest.k() == src1.k());

                if (!add_to)
                {
                    for (long k = 0; k < src1.k(); ++k)
                        d[k] = 0;
                }

                for (long n = 0; n < src1.num_samples(); ++n)
                {
                    for (long k = 0; k < src1.k(); ++k)
                    {
                        for (long r = 0; r < src1.nr(); ++r)
                        {
                            for (long c = 0; c < src1.nc(); ++c)
                            {
                                d[k] += (*s1++)*(*s2++);
                            }
                        }
                    }
                }
            }
        }